

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_helper.c
# Opt level: O3

uint32_t helper_clclu(CPUS390XState_conflict *env,uint32_t r1,uint64_t a2,uint32_t r3)

{
  ushort uVar1;
  int iVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  ushort uVar8;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  uint64_t ptr;
  uint64_t ptr_00;
  bool bVar12;
  uintptr_t unaff_retaddr;
  
  iVar2 = r1 + 1;
  uVar5 = (env->psw).mask;
  ptr = env->regs[(int)r1];
  bVar12 = (uVar5 & 0x100000000) != 0;
  uVar7 = (ulong)((uint)env->regs[iVar2] & 0x7fffffff);
  if (bVar12) {
    uVar7 = env->regs[iVar2];
  }
  if (!bVar12) {
    if ((int)uVar5 < 0) {
      ptr = (uint64_t)((uint)ptr & 0x7fffffff);
    }
    else {
      ptr = (uint64_t)((uint)ptr & 0xffffff);
    }
  }
  iVar6 = r3 + 1;
  uVar9 = env->regs[iVar6];
  uVar10 = (ulong)((uint)uVar9 & 0x7fffffff);
  ptr_00 = env->regs[(int)r3];
  if ((uVar5 & 0x100000000) == 0) {
    uVar9 = uVar10;
    if ((int)uVar5 < 0) {
      ptr_00 = (uint64_t)((uint)ptr_00 & 0x7fffffff);
    }
    else {
      ptr_00 = (uint64_t)((uint)ptr_00 & 0xffffff);
    }
  }
  uVar5 = uVar9;
  if (uVar9 < uVar7) {
    uVar5 = uVar7;
  }
  if ((((uint)uVar9 | (uint)uVar7) & 1) != 0) {
    tcg_s390_program_interrupt_s390x(env,6,unaff_retaddr);
  }
  if (uVar5 == 0) {
    uVar4 = 0;
  }
  else {
    uVar4 = (uint)(0x1000 < uVar5) * 3;
    uVar10 = 0x1000;
    if (uVar5 < 0x1000) {
      uVar10 = uVar5;
    }
    do {
      uVar1 = (ushort)a2;
      uVar8 = uVar1;
      if (uVar7 != 0) {
        uVar3 = cpu_lduw_data_ra_s390x(env,ptr,unaff_retaddr);
        uVar8 = (ushort)uVar3;
      }
      if (uVar9 != 0) {
        uVar3 = cpu_lduw_data_ra_s390x(env,ptr_00,unaff_retaddr);
        uVar1 = (ushort)uVar3;
      }
      if (uVar8 != uVar1) {
        uVar4 = 2 - (uVar8 < uVar1);
        break;
      }
      if (uVar7 != 0) {
        ptr = ptr + 2;
        uVar7 = uVar7 - 2;
      }
      bVar12 = uVar9 != 0;
      if (bVar12) {
        uVar9 = uVar9 - 2;
      }
      if (bVar12) {
        ptr_00 = ptr_00 + 2;
      }
      uVar10 = uVar10 - 2;
    } while (uVar10 != 0);
  }
  if (((env->psw).mask & 0x100000000) == 0) {
    uVar7 = uVar7 & 0xffffffff | env->regs[iVar2] & 0xffffffff00000000;
  }
  env->regs[iVar2] = uVar7;
  if (((env->psw).mask & 0x100000000) == 0) {
    uVar9 = uVar9 & 0xffffffff | env->regs[iVar6] & 0xffffffff00000000;
  }
  env->regs[iVar6] = uVar9;
  uVar5 = (env->psw).mask;
  if ((uVar5 & 0x100000000) == 0) {
    if ((int)uVar5 < 0) {
      uVar11 = (uint)ptr & 0x7fffffff;
      uVar5 = env->regs[(int)r1] & 0xffffffff00000000;
    }
    else {
      uVar5 = env->regs[(int)r1] & 0xffffffffff000000;
      uVar11 = (uint)ptr & 0xffffff;
    }
    ptr = uVar11 | uVar5;
  }
  env->regs[(int)r1] = ptr;
  uVar5 = (env->psw).mask;
  if ((uVar5 & 0x100000000) == 0) {
    if ((int)uVar5 < 0) {
      ptr_00 = (ulong)((uint)ptr_00 & 0x7fffffff) | env->regs[(int)r3] & 0xffffffff00000000;
    }
    else {
      ptr_00 = (ulong)((uint)ptr_00 & 0xffffff) | env->regs[(int)r3] & 0xffffffffff000000;
    }
  }
  env->regs[(int)r3] = ptr_00;
  return uVar4;
}

Assistant:

uint32_t HELPER(clclu)(CPUS390XState *env, uint32_t r1, uint64_t a2,
                       uint32_t r3)
{
    uintptr_t ra = GETPC();
    uint64_t src1len = get_length(env, r1 + 1);
    uint64_t src1 = get_address(env, r1);
    uint64_t src3len = get_length(env, r3 + 1);
    uint64_t src3 = get_address(env, r3);
    uint16_t pad = a2;
    uint32_t cc = 0;

    cc = do_clcl(env, &src1, &src1len, &src3, &src3len, pad, 0x1000, 2, ra);

    set_length(env, r1 + 1, src1len);
    set_length(env, r3 + 1, src3len);
    set_address(env, r1, src1);
    set_address(env, r3, src3);

    return cc;
}